

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O3

void vkt::ssbo::anon_unknown_15::generateImmScalarVectorSrc
               (ostream *src,DataType basicType,void *valuePtr)

{
  DataType DVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  ostream *poVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  ulong uVar7;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  string local_50;
  
  DVar1 = glu::getDataTypeScalarType(basicType);
  uVar2 = glu::getDataTypeScalarSize(basicType);
  if ((int)uVar2 < 2) {
    uVar8 = extraout_RDX;
    if (uVar2 != 1) {
      return;
    }
  }
  else {
    pcVar3 = glu::getDataTypeName(basicType);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)src + (int)*(undefined8 *)(*(long *)src + -0x18));
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(src,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(src,"(",1);
    uVar8 = extraout_RDX_00;
  }
  iVar10 = 0;
  uVar9 = 0;
  do {
    if (uVar9 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(src,", ",2);
      uVar8 = extraout_RDX_01;
    }
    lVar5 = (long)iVar10;
    if ((int)DVar1 < 0x1f) {
      if (DVar1 == TYPE_FLOAT) {
        de::floatToString_abi_cxx11_
                  (&local_50,(de *)&DAT_00000001,*(float *)((long)valuePtr + lVar5),(int)uVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (src,local_50._M_dataplus._M_p,local_50._M_string_length);
        uVar8 = extraout_RDX_03;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          uVar8 = extraout_RDX_04;
        }
      }
      else if (DVar1 == TYPE_INT) {
        std::ostream::operator<<(src,*(int *)((long)valuePtr + lVar5));
        uVar8 = extraout_RDX_02;
      }
    }
    else {
      if (DVar1 == TYPE_UINT) {
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)src);
        uVar7 = 1;
        pcVar3 = "u";
      }
      else {
        if (DVar1 != TYPE_BOOL) goto LAB_006c30bb;
        bVar11 = *(int *)((long)valuePtr + lVar5) == 0;
        pcVar3 = "true";
        if (bVar11) {
          pcVar3 = "false";
        }
        uVar7 = (ulong)bVar11 | 4;
        poVar6 = src;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar3,uVar7);
      uVar8 = extraout_RDX_05;
    }
LAB_006c30bb:
    uVar9 = uVar9 + 1;
    iVar10 = iVar10 + 4;
    if (uVar2 == uVar9) {
      if (1 < (int)uVar2) {
        std::__ostream_insert<char,std::char_traits<char>>(src,")",1);
      }
      return;
    }
  } while( true );
}

Assistant:

void generateImmScalarVectorSrc (std::ostream& src, glu::DataType basicType, const void* valuePtr)
{
	DE_ASSERT(glu::isDataTypeFloatOrVec(basicType)	||
			  glu::isDataTypeIntOrIVec(basicType)	||
			  glu::isDataTypeUintOrUVec(basicType)	||
			  glu::isDataTypeBoolOrBVec(basicType));

	const glu::DataType		scalarType		= glu::getDataTypeScalarType(basicType);
	const int				scalarSize		= glu::getDataTypeScalarSize(basicType);
	const int				compSize		= sizeof(deUint32);

	if (scalarSize > 1)
		src << glu::getDataTypeName(basicType) << "(";

	for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
	{
		const deUint8* compPtr = (const deUint8*)valuePtr + scalarNdx*compSize;

		if (scalarNdx > 0)
			src << ", ";

		switch (scalarType)
		{
			case glu::TYPE_FLOAT:	src << de::floatToString(*((const float*)compPtr), 1);			break;
			case glu::TYPE_INT:		src << *((const int*)compPtr);									break;
			case glu::TYPE_UINT:	src << *((const deUint32*)compPtr) << "u";						break;
			case glu::TYPE_BOOL:	src << (*((const deUint32*)compPtr) != 0u ? "true" : "false");	break;
			default:
				DE_ASSERT(false);
		}
	}

	if (scalarSize > 1)
		src << ")";
}